

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void mzd_from_char_array(mzd_local_t *result,uint8_t *data,size_t len)

{
  __uint64_t _Var1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  uint64_t tmp;
  size_t i;
  block_t *block;
  size_t word_count;
  size_t local_48;
  __uint64_t local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  ulong local_18;
  void *local_10;
  
  local_30 = in_RDX + 7 >> 3;
  local_28 = in_RDI;
  local_20 = local_30;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (; local_30 != 0; local_30 = local_30 - 1) {
    local_38 = 0;
    if (local_18 < 9) {
      local_48 = local_18;
    }
    else {
      local_48 = 8;
    }
    memcpy(&local_38,local_10,local_48);
    _Var1 = __bswap_64(local_38);
    *(__uint64_t *)(local_28 + (local_30 - 1) * 8) = _Var1;
    local_10 = (void *)((long)local_10 + 8);
    local_18 = local_18 - 8;
  }
  return;
}

Assistant:

void mzd_from_char_array(mzd_local_t* result, const uint8_t* data, size_t len) {
  const size_t word_count = (len + 7) / sizeof(uint64_t);
  block_t* block          = BLOCK(result, 0);

  for (size_t i = word_count; i; --i, data += sizeof(uint64_t), len -= sizeof(uint64_t)) {
    uint64_t tmp = 0;
    memcpy(&tmp, data, MIN(sizeof(tmp), len));
    block->w64[i - 1] = be64toh(tmp);
  }
}